

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
::find_soo<google::protobuf::Descriptor_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
           *this,key_arg<const_google::protobuf::Descriptor_*> *key)

{
  bool bVar1;
  slot_type *slot;
  pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>
  *ts;
  iterator iVar2;
  EqualElement<const_google::protobuf::Descriptor_*> local_38;
  key_arg<const_google::protobuf::Descriptor_*> *local_28;
  key_arg<const_google::protobuf::Descriptor_*> *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
  *this_local;
  
  local_28 = key;
  key_local = (key_arg<const_google::protobuf::Descriptor_*> *)this;
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                    *)this);
  if (!bVar1) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::MessagePtr>>, K = const google::protobuf::Descriptor *]"
                 );
  }
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
          ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                   *)this);
  if (!bVar1) {
    local_38.rhs = local_28;
    local_38.eq = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                  ::eq_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                            *)this);
    slot = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
           ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                       *)this);
    ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,void>
         ::
         element<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>
                   (slot);
    bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,void>
            ::
            apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>::EqualElement<google::protobuf::Descriptor_const*>,std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>&,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>
                      (&local_38,ts);
    if (bVar1) {
      iVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
              ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                              *)this);
      return iVar2;
    }
  }
  iVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
          ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
                 *)this);
  return iVar2;
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }